

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
DoCopy<JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
          (BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *other)

{
  uint uVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  DictionaryStats *pDVar7;
  size_t byteSize;
  
  if (*(int *)(this + 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x2b6,"(size == 0)","size == 0");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (*(int *)(this + 0x1c) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x2b7,"(bucketCount == 0)","bucketCount == 0");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (*(long *)this != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x2b8,"(!buckets)","!buckets");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (*(long *)(this + 8) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x2b9,"(!entries)","!entries");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (*(int *)(this + 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x2ba,"(count == 0)","count == 0");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (*(int *)(this + 0x28) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,699,"(freeCount == 0)","freeCount == 0");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (*(long *)(this + 0x30) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x2bd,"(!stats)","!stats");
    if (!bVar4) goto LAB_00595451;
    *puVar5 = 0;
  }
  if (other->count != other->freeCount) {
    if (other->bucketCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x2c5,"(other->bucketCount != 0)","other->bucketCount != 0");
      if (!bVar4) goto LAB_00595451;
      *puVar5 = 0;
    }
    if (other->size == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x2c6,"(other->size != 0)","other->size != 0");
      if (!bVar4) goto LAB_00595451;
      *puVar5 = 0;
    }
    if ((ulong)other->bucketCount == 0) {
      puVar6 = &DAT_00000008;
    }
    else {
      puVar6 = (undefined1 *)
               new__<Memory::JitArenaAllocator>
                         ((ulong)other->bucketCount << 2,*(JitArenaAllocator **)(this + 0x10),
                          0x3f1274);
    }
    *(undefined1 **)this = puVar6;
    if (puVar6 == (undefined1 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x2c9,"(buckets)","buckets");
      if (!bVar4) goto LAB_00595451;
      *puVar5 = 0;
    }
    if ((long)other->size == 0) {
      puVar6 = &DAT_00000008;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)other->size;
      byteSize = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
        byteSize = SUB168(auVar2 * ZEXT816(0xc),0);
      }
      puVar6 = (undefined1 *)
               new__<Memory::JitArenaAllocator>
                         (byteSize,*(JitArenaAllocator **)(this + 0x10),0x3f1274);
    }
    *(undefined1 **)(this + 8) = puVar6;
    if (puVar6 == (undefined1 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x2ce,"(entries)","entries");
      if (!bVar4) {
LAB_00595451:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    *(Type *)(this + 0x18) = other->size;
    uVar1 = other->bucketCount;
    *(uint *)(this + 0x1c) = uVar1;
    *(Type *)(this + 0x20) = other->count;
    *(Type *)(this + 0x24) = other->freeList;
    *(Type *)(this + 0x28) = other->freeCount;
    *(Type *)(this + 0x2c) = other->modFunctionIndex;
    Memory::CopyArray<int,int,Memory::Recycler>
              (*(int **)this,(ulong)uVar1,other->buckets,(ulong)uVar1);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,unsigned_int>,unsigned_int,Memory::JitArenaAllocator>
              (*(SimpleDictionaryEntry<unsigned_int,_unsigned_int> **)(this + 8),
               (long)*(int *)(this + 0x18),other->entries,(long)*(int *)(this + 0x18));
    pDVar7 = DictionaryStats::Create
                       ("PN6JsUtil14BaseDictionaryIjjN6Memory17JitArenaAllocatorE20DictionarySizePolicyI14PowerOf2PolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_21SimpleDictionaryEntryENS_12NoResizeLockEEE"
                        ,*(uint *)(this + 0x18));
    *(DictionaryStats **)(this + 0x30) = pDVar7;
  }
  return;
}

Assistant:

void DoCopy(const T *const other)
        {
            Assert(size == 0);
            Assert(bucketCount == 0);
            Assert(!buckets);
            Assert(!entries);
            Assert(count == 0);
            Assert(freeCount == 0);
#if PROFILE_DICTIONARY
            Assert(!stats);
#endif

            if(other->Count() == 0)
            {
                return;
            }

            Assert(other->bucketCount != 0);
            Assert(other->size != 0);

            buckets = AllocateBuckets(other->bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            try
            {
                entries = AllocateEntries(other->size, false /* zeroAllocate */);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, other->bucketCount);
                buckets = nullptr;
                throw;
            }

            size = other->size;
            bucketCount = other->bucketCount;
            count = other->count;
            freeList = other->freeList;
            freeCount = other->freeCount;
            modFunctionIndex = other->modFunctionIndex;

            CopyArray(buckets, bucketCount, other->buckets, bucketCount);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                entries, size, other->entries, size);

#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }